

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9HashmapValuesToSet(jx9_hashmap *pMap,SySet *pOut)

{
  uint local_2c;
  jx9_value *pjStack_28;
  sxu32 n;
  jx9_value *pValue;
  jx9_hashmap_node *pEntry;
  SySet *pOut_local;
  jx9_hashmap *pMap_local;
  
  pValue = (jx9_value *)pMap->pFirst;
  pEntry = (jx9_hashmap_node *)pOut;
  pOut_local = (SySet *)pMap;
  SySetInit(pOut,&pMap->pVm->sAllocator,8);
  for (local_2c = 0; local_2c < *(uint *)((long)&pOut_local[1].pAllocator + 4);
      local_2c = local_2c + 1) {
    pjStack_28 = HashmapExtractNodeValue((jx9_hashmap_node *)pValue);
    if (pjStack_28 != (jx9_value *)0x0) {
      SySetPut((SySet *)pEntry,&stack0xffffffffffffffd8);
    }
    pValue = *(jx9_value **)&pValue[1].iFlags;
  }
  return *(int *)&pEntry->xKey;
}

Assistant:

JX9_PRIVATE int jx9HashmapValuesToSet(jx9_hashmap *pMap, SySet *pOut)
{
	jx9_hashmap_node *pEntry = pMap->pFirst;
	jx9_value *pValue;
	sxu32 n;
	/* Initialize the container */
	SySetInit(pOut, &pMap->pVm->sAllocator, sizeof(jx9_value *));
	for(n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			SySetPut(pOut, (const void *)&pValue);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Total inserted entries */
	return (int)SySetUsed(pOut);
}